

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::MultisampleCase::renderTriangle
          (MultisampleCase *this,Vec3 *p0,Vec3 *p1,Vec3 *p2,Vec4 *c0,Vec4 *c1,Vec4 *c2)

{
  GLenum GVar1;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  float local_50;
  undefined4 local_4c;
  undefined8 local_48;
  float local_40;
  undefined4 local_3c;
  undefined8 local_38;
  float local_30;
  undefined4 local_2c;
  
  local_58 = *(undefined8 *)p0->m_data;
  local_50 = p0->m_data[2];
  local_4c = 0x3f800000;
  local_48 = *(undefined8 *)p1->m_data;
  local_40 = p1->m_data[2];
  local_3c = 0x3f800000;
  local_38 = *(undefined8 *)p2->m_data;
  local_30 = p2->m_data[2];
  local_2c = 0x3f800000;
  local_88 = *(undefined8 *)c0->m_data;
  uStack_80 = *(undefined8 *)(c0->m_data + 2);
  local_78 = *(undefined8 *)c1->m_data;
  uStack_70 = *(undefined8 *)(c1->m_data + 2);
  local_68 = *(undefined8 *)c2->m_data;
  uStack_60 = *(undefined8 *)(c2->m_data + 2);
  glwEnableVertexAttribArray(this->m_attrPositionLoc);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glEnableVertexAttribArray(m_attrPositionLoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0xf3);
  glwVertexAttribPointer(this->m_attrPositionLoc,4,0x1406,'\0',0,&local_58);
  GVar1 = glwGetError();
  glu::checkError(GVar1,
                  "glVertexAttribPointer(m_attrPositionLoc, 4, GL_FLOAT, false, 0, &vertexPositions[0])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0xf4);
  glwEnableVertexAttribArray(this->m_attrColorLoc);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glEnableVertexAttribArray(m_attrColorLoc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0xf6);
  glwVertexAttribPointer(this->m_attrColorLoc,4,0x1406,'\0',0,&local_88);
  GVar1 = glwGetError();
  glu::checkError(GVar1,
                  "glVertexAttribPointer(m_attrColorLoc, 4, GL_FLOAT, false, 0, &vertexColors[0])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0xf7);
  glwUseProgram((this->m_program->m_program).m_program);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glUseProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0xf9);
  glwDrawArrays(4,0,3);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glDrawArrays(GL_TRIANGLES, 0, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0xfa);
  return;
}

Assistant:

void MultisampleCase::renderTriangle (const Vec3& p0, const Vec3& p1, const Vec3& p2, const Vec4& c0, const Vec4& c1, const Vec4& c2) const
{
	float vertexPositions[] =
	{
		p0.x(), p0.y(), p0.z(), 1.0f,
		p1.x(), p1.y(), p1.z(), 1.0f,
		p2.x(), p2.y(), p2.z(), 1.0f
	};
	float vertexColors[] =
	{
		c0.x(), c0.y(), c0.z(), c0.w(),
		c1.x(), c1.y(), c1.z(), c1.w(),
		c2.x(), c2.y(), c2.z(), c2.w(),
	};

	GLU_CHECK_CALL(glEnableVertexAttribArray(m_attrPositionLoc));
	GLU_CHECK_CALL(glVertexAttribPointer(m_attrPositionLoc, 4, GL_FLOAT, false, 0, &vertexPositions[0]));

	GLU_CHECK_CALL(glEnableVertexAttribArray(m_attrColorLoc));
	GLU_CHECK_CALL(glVertexAttribPointer(m_attrColorLoc, 4, GL_FLOAT, false, 0, &vertexColors[0]));

	GLU_CHECK_CALL(glUseProgram(m_program->getProgram()));
	GLU_CHECK_CALL(glDrawArrays(GL_TRIANGLES, 0, 3));
}